

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDisk.cpp
# Opt level: O0

uchar __thiscall IDisk::GetNextBit(IDisk *this,int side,int track)

{
  int iVar1;
  uint uVar2;
  byte local_21;
  bool one_more;
  uchar value;
  int track_local;
  int side_local;
  IDisk *this_local;
  
  if (this->side_[side].tracks[track].bitfield == (uchar *)0x0) {
    iVar1 = rand();
    this_local._7_1_ = (byte)iVar1 & 1;
  }
  else {
    local_21 = this->side_[side].tracks[track].bitfield[this->head_position_];
    if ((local_21 & 0xf2) != 0) {
      if (this->log_ != (ILog *)0x0) {
        (**(code **)(*(long *)this->log_ + 0x18))(this->log_,this->head_position_);
      }
      if (this->log_ != (ILog *)0x0) {
        (**(code **)(*(long *)this->log_ + 0x18))(this->log_,local_21);
      }
      local_21 = local_21 & 0xd;
      if (this->log_ != (ILog *)0x0) {
        (**(code **)(*(long *)this->log_ + 0x18))(this->log_,local_21);
      }
    }
    if (this->head_position_ < 2) {
      local_21 = local_21 | 2;
    }
    if (((local_21 & 8) == 8) && (uVar2 = rand(), (uVar2 & 1) != 0)) {
      this->head_position_ = this->head_position_ + 1;
      if (this->side_[side].tracks[track].size <= this->head_position_) {
        this->head_position_ = 0;
      }
      local_21 = this->side_[side].tracks[track].bitfield[this->head_position_] | local_21 & 2;
    }
    if ((local_21 & 4) == 4) {
      iVar1 = rand();
      local_21 = (byte)iVar1 & 1 | local_21 & 2;
    }
    this->head_position_ = this->head_position_ + 1;
    if (this->side_[side].tracks[track].size <= this->head_position_) {
      this->head_position_ = 0;
    }
    this_local._7_1_ = local_21 & 3;
  }
  return this_local._7_1_;
}

Assistant:

unsigned char IDisk::GetNextBit(int side, int track)
{
   // Sanity check
   if (side_[side].tracks[track].bitfield == nullptr)
   {
      return (rand() & 0x1);
   }

   unsigned char value = side_[side].tracks[track].bitfield[head_position_];

   if (value & 0xF2)
   {
      // SOMETHING STRANGE ! - Lots of error if this is not removed !!!
      LOG(head_position_);
      LOG(value);
      value &= 0x0D;
      LOG(value);
   }
   if (head_position_ < 2)
      value |= BIT_INDEX;

   // Return current bit (0 = index)
   if ((value & BIT_OPTIONAL) == BIT_OPTIONAL)
   {
      bool one_more;
      
      {
         one_more = rand() & 0x1;
      }
      
      if (one_more)
      {
         ++head_position_;
         if (head_position_ >= side_[side].tracks[track].size)
         {
            head_position_ = 0;
         }
         value = side_[side].tracks[track].bitfield[head_position_] | (value & BIT_INDEX);
      }
   }

   if ((value & BIT_WEAK) == BIT_WEAK)
   {
      value = (rand() & 0x1) | (value & BIT_INDEX);
   }

   // Get next bit
   ++head_position_;
   if (head_position_ >= side_[side].tracks[track].size)
   {
      head_position_ = 0;
   }

   return (value & 0x3);
}